

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int CompareMeshPoint(void *a,void *b,void *ptr)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  
  lVar1 = *(long *)((long)ptr + 8);
  lVar6 = (long)((int)b - *ptr);
  lVar4 = lVar6 * 0xc;
  lVar7 = (long)((int)a - *ptr);
  lVar5 = lVar7 * 0xc;
  fVar8 = *(float *)(lVar1 + lVar4) - *(float *)(lVar1 + lVar5);
  if ((fVar8 == 0.0) && (!NAN(fVar8))) {
    fVar8 = *(float *)(lVar1 + lVar4 + 4) - *(float *)(lVar1 + lVar5 + 4);
    if ((fVar8 == 0.0) && (!NAN(fVar8))) {
      fVar10 = *(float *)(lVar1 + lVar4 + 8) - *(float *)(lVar1 + lVar5 + 8);
      if (((fVar10 == 0.0) && (!NAN(fVar10))) && (lVar1 = *(long *)((long)ptr + 0x18), lVar1 != 0))
      {
        fVar10 = *(float *)(lVar1 + lVar4) - *(float *)(lVar1 + lVar5);
        if ((fVar10 == 0.0) && (!NAN(fVar10))) {
          fVar10 = *(float *)(lVar4 + lVar1 + 4) - *(float *)(lVar5 + lVar1 + 4);
          if ((fVar10 == 0.0) && (!NAN(fVar10))) {
            fVar10 = *(float *)(lVar4 + lVar1 + 8) - *(float *)(lVar5 + lVar1 + 8);
          }
        }
      }
      if (((fVar10 == 0.0) && (!NAN(fVar10))) && (lVar1 = *(long *)((long)ptr + 0x10), lVar1 != 0))
      {
        fVar10 = *(float *)(lVar1 + lVar6 * 8) - *(float *)(lVar1 + lVar7 * 8);
        if ((fVar10 == 0.0) && (!NAN(fVar10))) {
          fVar10 = *(float *)(lVar1 + 4 + lVar6 * 8) - *(float *)(lVar1 + 4 + lVar7 * 8);
        }
      }
      fVar8 = fVar10;
      if ((fVar10 == 0.0) && (!NAN(fVar10))) {
        if (*(long *)((long)ptr + 0x28) != 0) {
          uVar2 = ON_Color::operator_cast_to_unsigned_int
                            ((ON_Color *)(*(long *)((long)ptr + 0x28) + lVar6 * 4));
          uVar3 = ON_Color::operator_cast_to_unsigned_int
                            ((ON_Color *)(lVar7 * 4 + *(long *)((long)ptr + 0x28)));
          if ((int)uVar2 < (int)uVar3) {
            fVar8 = -1.0;
            goto LAB_0051b0a8;
          }
          if (uVar2 != uVar3) {
            fVar8 = 1.0;
            goto LAB_0051b0a8;
          }
        }
        lVar1 = *(long *)((long)ptr + 0x20);
        if (lVar1 != 0) {
          dVar9 = *(double *)(lVar1 + lVar6 * 0x10) - *(double *)(lVar1 + lVar7 * 0x10);
          fVar8 = -1.0;
          if ((0.0 <= dVar9) &&
             ((0.0 < dVar9 ||
              ((dVar9 = *(double *)(lVar6 * 0x10 + lVar1 + 8) -
                        *(double *)(lVar7 * 0x10 + lVar1 + 8), 0.0 <= dVar9 &&
               (fVar8 = fVar10, 0.0 < dVar9)))))) {
            fVar8 = 1.0;
          }
        }
      }
    }
  }
LAB_0051b0a8:
  uVar2 = 0xffffffff;
  if (0.0 <= fVar8) {
    uVar2 = (uint)(0.0 < fVar8);
  }
  return uVar2;
}

Assistant:

static int CompareMeshPoint(const void* a,const void* b,void* ptr)
{
  float d;
  const struct tagMESHPOINTS * mp = (const struct tagMESHPOINTS *)ptr;

  // use bogus pointer to convert a,b into vertex indices
  int i = (int)(((const char*)a) - mp->p0); // the (int) is for 64 bit size_t conversion
  int j = (int)(((const char*)b) - mp->p0);

  d = mp->V[j].x - mp->V[i].x;
  if ( d == 0.0f )
  {
    d = mp->V[j].y - mp->V[i].y;
    if ( d == 0.0f )
    {
      d = mp->V[j].z - mp->V[i].z;

      //if ( d == 0.0f )
      //  return 0;

      if ( d == 0.0f && 0 != mp->N)
      {
        d = mp->N[j].x - mp->N[i].x;
        if ( d == 0.0f )
        {
          d = mp->N[j].y - mp->N[i].y;
          if ( d == 0.0f )
          {
            d = mp->N[j].z - mp->N[i].z;
          }
        }
      }

      if ( d == 0.0f && 0 != mp->T)
      {
        d = mp->T[j].x - mp->T[i].x;
        if ( d == 0.0f )
        {
          d = mp->T[j].y - mp->T[i].y;
        }
      }

      if ( d == 0.0f && 0 != mp->C )
      {
        int u = ((int)mp->C[j])-((int)mp->C[i]);
        if ( u < 0 )
          d = -1.0f;
        else if ( u > 0 )
          d = 1.0f;
      }

      if ( d == 0.0f && 0 != mp->K )
      {
        double dk = mp->K[j].k1 - mp->K[i].k1;
        if ( dk < 0.0 )
          d = -1.0;
        else if ( dk > 0.0 )
          d = 1.0;
        else
        {
          dk = mp->K[j].k2 - mp->K[i].k2;
          if ( dk < 0.0 )
            d = -1.0;
          else if ( dk > 0.0 )
            d = 1.0;
        }
      }
    }
  }
  
  if ( d < 0.0f )
    return -1;
  if ( d > 0.0f )
    return 1;
  return 0;
}